

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>
          (ChArchiveIn *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  char *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  char local_18;
  
  local_28 = bVal->_name;
  pbStack_20 = bVal->_value;
  local_18 = bVal->_flags;
  (**(code **)(*(long *)this + 0x40))(this,&local_28);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }